

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::Draw(DStrifeStatusBar *this,EHudState state)

{
  int bottom;
  EHudState state_local;
  DStrifeStatusBar *this_local;
  
  DBaseStatusBar::Draw(&this->super_DBaseStatusBar,state);
  if (state == HUD_StatusBar) {
    if (SB_state != 0) {
      SB_state = SB_state + -1;
    }
    DrawMainBar(this);
  }
  else {
    if (state == HUD_Fullscreen) {
      ST_SetNeedRefresh();
      DrawFullScreenStuff(this);
    }
    if ((this->CurrentPop != 0) && (this->PopHeight < 0)) {
      bottom = DCanvas::GetHeight((DCanvas *)screen);
      DrawPopScreen(this,bottom);
    }
  }
  return;
}

Assistant:

void Draw (EHudState state)
	{
		DBaseStatusBar::Draw (state);

		if (state == HUD_StatusBar)
		{
			if (SB_state != 0)
			{
				SB_state--;
			}
			DrawMainBar ();
		}
		else
		{
			if (state == HUD_Fullscreen)
			{
				ST_SetNeedRefresh();
				DrawFullScreenStuff ();
			}

			// Draw pop screen (log, keys, and status)
			if (CurrentPop != POP_None && PopHeight < 0)
			{
				DrawPopScreen (screen->GetHeight());
			}
		}
	}